

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O1

bool __thiscall
ctemplate::SectionTemplateNode::AddTextNode
          (SectionTemplateNode *this,TemplateToken *token,Template *my_template)

{
  size_t *psVar1;
  char *pcVar2;
  long lVar3;
  HtmlParser *pHVar4;
  int iVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  long *plVar8;
  undefined8 *puVar9;
  size_t sVar10;
  ostream *poVar11;
  long *plVar12;
  ulong *puVar13;
  ulong uVar14;
  string error_msg;
  char *local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  HtmlParser *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (token == (TemplateToken *)0x0) {
    __assert_fail("token",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                  ,0x603,
                  "bool ctemplate::SectionTemplateNode::AddTextNode(const TemplateToken *, Template *)"
                 );
  }
  if (token->textlen == 0) {
    return true;
  }
  local_78 = my_template->htmlparser_;
  p_Var6 = (_List_node_base *)operator_new(0x38);
  p_Var6->_M_next = (_List_node_base *)&PTR__TextTemplateNode_0014d388;
  p_Var7 = (_List_node_base *)token->text;
  p_Var6->_M_prev = *(_List_node_base **)token;
  p_Var6[1]._M_next = p_Var7;
  p_Var6[1]._M_prev = (_List_node_base *)token->textlen;
  std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::vector
            ((vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *)
             (p_Var6 + 2),&token->modvals);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = p_Var6;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  pHVar4 = local_78;
  psVar1 = &(this->node_list_).
            super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (2 < my_template->initial_context_ - TC_HTML) {
    return true;
  }
  if (local_78 == (HtmlParser *)0x0) {
    __assert_fail("htmlparser",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                  ,0x60a,
                  "bool ctemplate::SectionTemplateNode::AddTextNode(const TemplateToken *, Template *)"
                 );
  }
  iVar5 = ctemplate_htmlparser::htmlparser_state(local_78->parser_);
  if ((iVar5 != 7) &&
     (iVar5 = ctemplate_htmlparser::htmlparser_parse
                        (pHVar4->parser_,token->text,(int)token->textlen), iVar5 != 7)) {
    return true;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,token->text,token->text + token->textlen);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1321f1);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_60 = *plVar12;
    lStack_58 = plVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar12;
    local_70 = (long *)*plVar8;
  }
  local_68 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_a8 = *puVar13;
    uStack_a0 = (undefined4)plVar8[3];
    uStack_9c = *(undefined4 *)((long)plVar8 + 0x1c);
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar13;
    local_b8 = (ulong *)*plVar8;
  }
  local_b0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  pcVar2 = (this->token_).text;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,pcVar2,pcVar2 + (this->token_).textlen);
  uVar14 = 0xf;
  if (local_b8 != &local_a8) {
    uVar14 = local_a8;
  }
  if (uVar14 < (ulong)(local_90 + local_b0)) {
    uVar14 = 0xf;
    if (local_98 != local_88) {
      uVar14 = local_88[0];
    }
    if ((ulong)(local_90 + local_b0) <= uVar14) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
      goto LAB_0011a4be;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
LAB_0011a4be:
  local_d8 = (char *)&local_c8;
  pcVar2 = (char *)(puVar9 + 2);
  if ((char *)*puVar9 == pcVar2) {
    local_c8 = *(undefined8 *)pcVar2;
    uStack_c0 = puVar9[3];
  }
  else {
    local_c8 = *(undefined8 *)pcVar2;
    local_d8 = (char *)*puVar9;
  }
  lVar3 = puVar9[1];
  *puVar9 = pcVar2;
  puVar9[1] = 0;
  *pcVar2 = '\0';
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Template ",9);
  pcVar2 = (my_template->resolved_filename_)._M_dataplus._M_p;
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x150388);
  }
  else {
    sVar10 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR: ",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Auto-Escape: ",0xd);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_d8,lVar3)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if (local_d8 != (char *)&local_c8) {
    operator_delete(local_d8);
  }
  return false;
}

Assistant:

bool SectionTemplateNode::AddTextNode(const TemplateToken* token,
                                      Template* my_template) {
  assert(token);
  bool success = true;
  HtmlParser *htmlparser = my_template->htmlparser_;

  if (token->textlen > 0) {  // ignore null text sections
    node_list_.push_back(new TextTemplateNode(*token));
    if (AUTO_ESCAPE_PARSING_CONTEXT(my_template->initial_context_)) {
      assert(htmlparser);
      if (htmlparser->state() == HtmlParser::STATE_ERROR ||
          htmlparser->Parse(token->text, static_cast<int>(token->textlen)) ==
          HtmlParser::STATE_ERROR) {
        string error_msg =  "Failed parsing: " +
            string(token->text, token->textlen) +
            "\nIn: " + string(token_.text, token_.textlen);
        LOG_AUTO_ESCAPE_ERROR(error_msg, my_template);
        success = false;
      }
    }
  }
  return success;
}